

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

csubstr __thiscall c4::yml::Parser::_slurp_doc_scalar(Parser *this)

{
  State *pSVar1;
  ulong uVar2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  csubstr s;
  csubstr s_00;
  csubstr s_01;
  csubstr cVar7;
  bool bVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  long lVar14;
  byte bVar15;
  csubstr cVar16;
  ro_substr chars;
  ro_substr chars_00;
  char msg [73];
  basic_substring<const_char> local_118;
  size_t local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  char *pcStack_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  char *pcStack_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  char *pcStack_98;
  undefined8 local_90;
  char local_88 [72];
  undefined1 local_40;
  
  bVar15 = 0;
  pSVar1 = this->m_state;
  local_118.str = (pSVar1->line_contents).rem.str;
  local_118.len = (pSVar1->line_contents).rem.len;
  sVar10 = (pSVar1->pos).super_LineCol.offset;
  uVar2 = (pSVar1->line_contents).full.len;
  if (2 < uVar2) {
    lVar11 = 0;
    local_108 = sVar10;
    do {
      lVar14 = 0;
      while( true ) {
        if ((pSVar1->line_contents).full.len <= (ulong)(lVar14 + lVar11)) {
          _slurp_doc_scalar();
        }
        sVar10 = local_108;
        if ((pSVar1->line_contents).full.str[lVar14 + lVar11] != "---"[lVar14]) break;
        lVar14 = lVar14 + 1;
        if (lVar14 == 3) {
          if (lVar11 == -1) goto LAB_001daabc;
          goto LAB_001dab69;
        }
      }
      bVar8 = lVar11 != uVar2 - 3;
      lVar11 = lVar11 + 1;
    } while (bVar8);
  }
LAB_001daabc:
  pcVar12 = "check failed: (m_state->line_contents.full.find(\"---\") != csubstr::npos)";
  pcVar13 = local_88;
  for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
    *(undefined8 *)pcVar13 = *(undefined8 *)pcVar12;
    pcVar12 = pcVar12 + ((ulong)bVar15 * -2 + 1) * 8;
    pcVar13 = pcVar13 + ((ulong)bVar15 * -2 + 1) * 8;
  }
  local_40 = 0;
  if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
    pcVar3 = (code *)swi(3);
    cVar16 = (csubstr)(*pcVar3)();
    return cVar16;
  }
  local_b0 = 0;
  uStack_a8 = 0x72d4;
  local_a0 = 0;
  pcStack_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  local_90 = 0x65;
  LVar4.super_LineCol.col = 0;
  LVar4.super_LineCol.offset = SUB168(ZEXT816(0x72d4) << 0x40,0);
  LVar4.super_LineCol.line = SUB168(ZEXT816(0x72d4) << 0x40,8);
  LVar4.name.str =
       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  LVar4.name.len = 0x65;
  (*(this->m_stack).m_callbacks.m_error)
            (local_88,0x49,LVar4,(this->m_stack).m_callbacks.m_user_data);
LAB_001dab69:
  if (local_118.len == 0) {
    _line_ended(this);
    _scan_line(this);
    pSVar1 = this->m_state;
    local_118.str = (pSVar1->line_contents).rem.str;
    local_118.len = (pSVar1->line_contents).rem.len;
    sVar10 = (pSVar1->pos).super_LineCol.offset;
  }
  chars.len = 2;
  chars.str = " \t";
  sVar9 = basic_substring<const_char>::first_not_of(&local_118,chars,0);
  if (sVar9 != 0xffffffffffffffff) {
    _line_progressed(this,sVar9);
    pSVar1 = this->m_state;
    local_118.str = (pSVar1->line_contents).rem.str;
    local_118.len = (pSVar1->line_contents).rem.len;
    sVar10 = (pSVar1->pos).super_LineCol.offset;
  }
  if (((this->m_val_anchor).len != 0) && ((this->m_val_anchor).str != (char *)0x0)) {
    builtin_strncpy(local_88,"check failed: (m_val_anchor.empty())",0x25);
    if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar3 = (code *)swi(3);
      cVar16 = (csubstr)(*pcVar3)();
      return cVar16;
    }
    local_d8 = 0;
    uStack_d0 = 0x72e8;
    local_c8 = 0;
    pcStack_c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_b8 = 0x65;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x72e8) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x72e8) << 0x40,8);
    LVar5.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar5.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_88,0x25,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  _handle_val_anchors_and_refs(this);
  if (((this->m_val_anchor).len != 0) && ((this->m_val_anchor).str != (char *)0x0)) {
    local_118.str = (this->m_state->line_contents).rem.str;
    local_118.len = (this->m_state->line_contents).rem.len;
    chars_00.len = 2;
    chars_00.str = " \t";
    sVar10 = basic_substring<const_char>::first_not_of(&local_118,chars_00,0);
    if (sVar10 != 0xffffffffffffffff) {
      _line_progressed(this,sVar10);
    }
    pSVar1 = this->m_state;
    local_118.str = (pSVar1->line_contents).rem.str;
    local_118.len = (pSVar1->line_contents).rem.len;
    sVar10 = (pSVar1->pos).super_LineCol.offset;
  }
  s_00.len = local_118.len;
  s_00.str = local_118.str;
  s.len = local_118.len;
  s.str = local_118.str;
  cVar16.len = local_118.len;
  cVar16.str = local_118.str;
  if (local_118.len != 0) {
    bVar15 = *local_118.str;
    if (bVar15 < 0x3e) {
      if (bVar15 == 0x22) {
        sVar10 = LineContents::current_col(&this->m_state->line_contents,s_00);
        this->m_state->scalar_col = sVar10;
        cVar16 = _scan_dquot_scalar(this);
        return cVar16;
      }
      if (bVar15 == 0x27) {
        sVar10 = LineContents::current_col(&this->m_state->line_contents,cVar16);
        this->m_state->scalar_col = sVar10;
        cVar16 = _scan_squot_scalar(this);
        return cVar16;
      }
    }
    else if ((bVar15 == 0x3e) || (bVar15 == 0x7c)) {
      cVar16 = _scan_block(this);
      return cVar16;
    }
  }
  sVar9 = LineContents::current_col(&this->m_state->line_contents,s);
  this->m_state->scalar_col = sVar9;
  pcVar12 = (this->m_buf).str;
  if (local_118.str + local_118.len < pcVar12 + sVar10) {
    builtin_strncpy(local_88 + 0x10,".end() >= m_buf.begin() + pos)",0x1f);
    builtin_strncpy(local_88,"check failed: (s",0x10);
    if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar3 = (code *)swi(3);
      cVar16 = (csubstr)(*pcVar3)();
      return cVar16;
    }
    local_100 = 0;
    uStack_f8 = 0x7309;
    local_f0 = 0;
    pcStack_e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_e0 = 0x65;
    LVar6.super_LineCol.col = 0;
    LVar6.super_LineCol.offset = SUB168(ZEXT816(0x7309) << 0x40,0);
    LVar6.super_LineCol.line = SUB168(ZEXT816(0x7309) << 0x40,8);
    LVar6.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar6.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_88,0x2f,LVar6,(this->m_stack).m_callbacks.m_user_data);
    pcVar12 = (this->m_buf).str;
  }
  _line_progressed(this,(size_t)(local_118.str + (local_118.len - (long)(pcVar12 + sVar10))));
  pcVar12 = (this->m_state->line_contents).rem.str;
  sVar10 = (this->m_state->line_contents).rem.len;
  if (pcVar12 != (char *)0x0 && sVar10 != 0) {
    sVar9 = 0;
    do {
      if (pcVar12[sVar9] != ' ') {
        cVar7.len = local_118.len;
        cVar7.str = local_118.str;
        return cVar7;
      }
      sVar9 = sVar9 + 1;
    } while (sVar10 != sVar9);
  }
  s_01.len = local_118.len;
  s_01.str = local_118.str;
  cVar16 = _extend_scanned_scalar(this,s_01);
  return cVar16;
}

Assistant:

csubstr Parser::_slurp_doc_scalar()
{
    csubstr s = m_state->line_contents.rem;
    size_t pos = m_state->pos.offset;
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->line_contents.full.find("---") != csubstr::npos);
    _c4dbgpf("slurp 0 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));
    if(s.len == 0)
    {
        _line_ended();
        _scan_line();
        s = m_state->line_contents.rem;
        pos = m_state->pos.offset;
    }

    size_t skipws = s.first_not_of(" \t");
    _c4dbgpf("slurp 1 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));
    if(skipws != npos)
    {
        _line_progressed(skipws);
        s = m_state->line_contents.rem;
        pos = m_state->pos.offset;
        _c4dbgpf("slurp 2 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, m_val_anchor.empty());
    _handle_val_anchors_and_refs();
    if(!m_val_anchor.empty())
    {
        s = m_state->line_contents.rem;
        skipws = s.first_not_of(" \t");
        if(skipws != npos)
        {
            _line_progressed(skipws);
        }
        s = m_state->line_contents.rem;
        pos = m_state->pos.offset;
        _c4dbgpf("slurp 3 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));
    }

    if(s.begins_with('\''))
    {
        m_state->scalar_col = m_state->line_contents.current_col(s);
        return _scan_squot_scalar();
    }
    else if(s.begins_with('"'))
    {
        m_state->scalar_col = m_state->line_contents.current_col(s);
        return _scan_dquot_scalar();
    }
    else if(s.begins_with('|') || s.begins_with('>'))
    {
        return _scan_block();
    }

    _c4dbgpf("slurp 4 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));

    m_state->scalar_col = m_state->line_contents.current_col(s);
    _RYML_CB_ASSERT(m_stack.m_callbacks, s.end() >= m_buf.begin() + pos);
    _line_progressed(static_cast<size_t>(s.end() - (m_buf.begin() + pos)));

    _c4dbgpf("slurp 5 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));

    if(_at_line_end())
    {
        _c4dbgpf("at line end. curr='{}'", s);
        s = _extend_scanned_scalar(s);
    }

    _c4dbgpf("scalar was '{}'", s);

    return s;
}